

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int writeYamlDataToStream(Data data,FILE *fp)

{
  int iVar1;
  fy_document *doc;
  fy_node *fyn;
  
  doc = fy_document_create((fy_parse_cfg *)0x0);
  fyn = encodeYaml(doc,data);
  fy_document_set_root(doc,fyn);
  iVar1 = fy_emit_document_to_fp(doc,FYECF_SORT_KEYS,fp);
  fy_document_destroy(doc);
  return iVar1;
}

Assistant:

int writeYamlDataToStream(Data data, FILE *fp) {
    struct fy_document *doc = fy_document_create(NULL);
    struct fy_node *root = encodeYaml(doc, data);
    fy_document_set_root(doc, root);
    int ret = fy_emit_document_to_fp(doc, FYECF_SORT_KEYS, fp);
    fy_document_destroy(doc);
    return ret;
}